

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propertyprinter.cpp
# Opt level: O2

void jsonPropertyPrinter(QList<std::pair<QString,_QString>_> *values)

{
  long lVar1;
  pair<QString,_QString> *val;
  pair<QString,_QString> *ppVar2;
  long in_FS_OFFSET;
  QJsonDocument document;
  QJsonObject object;
  undefined8 local_58;
  undefined8 local_50;
  QArrayDataPointer<char> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = 0xaaaaaaaaaaaaaaaa;
  QJsonObject::QJsonObject((QJsonObject *)&local_50);
  ppVar2 = (values->d).ptr;
  for (lVar1 = (values->d).size * 0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
    QJsonValue::QJsonValue((QJsonValue *)&local_48,(QString *)&ppVar2->second);
    QJsonObject::insert((QString *)&local_50,(QJsonValue *)ppVar2);
    QJsonValue::~QJsonValue((QJsonValue *)&local_48);
    ppVar2 = ppVar2 + 1;
  }
  local_58 = 0xaaaaaaaaaaaaaaaa;
  QJsonDocument::QJsonDocument((QJsonDocument *)&local_58,(QJsonObject *)&local_50);
  QJsonDocument::toJson(&local_48,&local_58,0);
  if (local_48.ptr == (char *)0x0) {
    local_48.ptr = (char *)&QByteArray::_empty;
  }
  std::operator<<((ostream *)&std::cout,local_48.ptr);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_48);
  QJsonDocument::~QJsonDocument((QJsonDocument *)&local_58);
  QJsonObject::~QJsonObject((QJsonObject *)&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void jsonPropertyPrinter(const QList<QPair<QString, QString>> &values)
{
    QJsonObject object;
    for (const auto &val : values)
        object.insert(val.first, val.second);

    QJsonDocument document(object);
    std::cout << document.toJson().constData();
}